

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::transfer_n(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             *this,size_type n,size_type dest_i,size_type src_i,
            btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            *src_node,allocator_type *alloc)

{
  slot_type *psVar1;
  long in_RSI;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *in_RDI;
  slot_type *dest;
  slot_type *end;
  slot_type *src;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  slot_type *local_38;
  
  next_generation(in_RDI);
  local_38 = slot(in_RDI,in_stack_ffffffffffffffac);
  psVar1 = local_38 + in_RSI;
  slot(in_RDI,in_stack_ffffffffffffffac);
  for (; local_38 != psVar1; local_38 = local_38 + 1) {
    transfer((slot_type *)in_RDI,
             (slot_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (allocator_type *)0x191eb3);
  }
  return;
}

Assistant:

void transfer_n(const size_type n, const size_type dest_i,
                  const size_type src_i, btree_node *src_node,
                  allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i), *end = src + n,
                   *dest = slot(dest_i);
         src != end; ++src, ++dest) {
      transfer(dest, src, alloc);
    }
  }